

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecs.hpp
# Opt level: O3

void __thiscall sciplot::GridSpecs::GridSpecs(GridSpecs *this)

{
  string local_38;
  
  *(undefined ***)&(this->super_GridSpecsBase).super_LineSpecsOf<sciplot::GridSpecsBase> =
       &PTR__Specs_001a6088;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  GridSpecsBase::GridSpecsBase(&this->super_GridSpecsBase,&PTR_PTR_001a4fa0,&local_38,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_GridSpecsBase).super_LineSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001a4f00;
  *(undefined ***)&(this->super_GridSpecsBase).super_DepthSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001a4f40;
  *(undefined ***)&(this->super_GridSpecsBase).super_ShowSpecsOf<sciplot::GridSpecsBase> =
       &PTR__GridSpecs_001a4f80;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_gridticsspecs).
  super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GridSpecsBase).super_ShowSpecsOf<sciplot::GridSpecsBase>.m_show = false;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_GridSpecsBase).super_DepthSpecsOf<sciplot::GridSpecsBase>.m_depth,
             0,(char *)(this->super_GridSpecsBase).super_DepthSpecsOf<sciplot::GridSpecsBase>.
                       m_depth._M_string_length,0x18d4e5);
  return;
}

Assistant:

inline GridSpecs::GridSpecs()
: GridSpecsBase("", true)
{
    show(false);
    back();
}